

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcd.cpp
# Opt level: O1

void __thiscall GPIO::HitachiLCDBase::int_out_nibble(HitachiLCDBase *this,bool data,uchar out)

{
  uint uVar1;
  int iVar2;
  int *piVar3;
  size_t __n;
  void *__buf;
  uint uVar4;
  long lVar5;
  long lVar6;
  timespec local_30;
  
  if (this->m_i2c != false) {
    uVar4 = (uint)(byte)(out << 4);
    if (this->m_upper_expander == false) {
      uVar4 = (uint)out;
    }
    __n = 0;
    uVar1 = 0;
    if (data) {
      uVar1 = this->m_rs;
    }
    if (this->m_backlit != this->m_inverted_backlight_toggle) {
      __n = (size_t)this->m_backlight;
    }
    uVar4 = (uVar1 | uVar4 | (uint)__n) & 0xff;
    I2C::write(&this->i2c,this->m_en | uVar4,(void *)(ulong)this->m_backlit,__n);
    I2C::write(&this->i2c,uVar4,__buf,__n);
    return;
  }
  lVar5 = 0x50;
  if (data) {
    lVar5 = 0x38;
  }
  *(long *)((long)GPIOBase::gpio_addr + (ulong)(this->m_rs >> 5) * 8 + lVar5) =
       (long)(1 << ((byte)this->m_rs & 0x1f));
  lVar5 = 0x50;
  if ((out & 1) != 0) {
    lVar5 = 0x38;
  }
  *(long *)((long)GPIOBase::gpio_addr + (ulong)(this->m_d4 >> 5) * 8 + lVar5) =
       (long)(1 << ((byte)this->m_d4 & 0x1f));
  lVar5 = 0x50;
  if ((out & 2) != 0) {
    lVar5 = 0x38;
  }
  *(long *)((long)GPIOBase::gpio_addr + (ulong)(this->m_d5 >> 5) * 8 + lVar5) =
       (long)(1 << ((byte)this->m_d5 & 0x1f));
  lVar5 = 0x50;
  if ((out & 4) != 0) {
    lVar5 = 0x38;
  }
  lVar6 = 0x50;
  *(long *)((long)GPIOBase::gpio_addr + (ulong)(this->m_d6 >> 5) * 8 + lVar5) =
       (long)(1 << ((byte)this->m_d6 & 0x1f));
  if ((out & 8) != 0) {
    lVar6 = 0x38;
  }
  *(long *)((long)GPIOBase::gpio_addr + (ulong)(this->m_d7 >> 5) * 8 + lVar6) =
       (long)(1 << ((byte)this->m_d7 & 0x1f));
  GPIOBase::gpio_addr[(ulong)(this->m_en >> 5) + 7] = (long)(1 << ((byte)this->m_en & 0x1f));
  local_30.tv_sec = 0;
  local_30.tv_nsec = 55000;
  do {
    iVar2 = nanosleep(&local_30,&local_30);
    if (iVar2 != -1) break;
    piVar3 = __errno_location();
  } while (*piVar3 == 4);
  GPIOBase::gpio_addr[(ulong)(this->m_en >> 5) + 10] = (long)(1 << ((byte)this->m_en & 0x1f));
  local_30.tv_sec = 0;
  local_30.tv_nsec = 55000;
  do {
    iVar2 = nanosleep(&local_30,&local_30);
    if (iVar2 != -1) {
      return;
    }
    piVar3 = __errno_location();
  } while (*piVar3 == 4);
  return;
}

Assistant:

void HitachiLCDBase::int_out_nibble(bool data, unsigned char out) const
{
    if (!m_i2c) {

        // display directly attached to GPIO

        gpio.write(m_rs, data);
        gpio.write(m_d4, out & 1);
        out >>= 1;
        gpio.write(m_d5, out & 1);
        out >>= 1;
        gpio.write(m_d6, out & 1);
        out >>= 1;
        gpio.write(m_d7, out & 1);

        // send enable (strobe) to display

        gpio.set(m_en);
        std::this_thread::sleep_for(std::chrono::microseconds(55));

        // clear enable (the display takes the data on the falling edge)

        gpio.clear(m_en);
        std::this_thread::sleep_for(std::chrono::microseconds(55));

    } else {

        // display attached on I2C bus

        unsigned char ctrl = out;
        if (m_upper_expander) {
            ctrl <<= 4;
        }
        if (data) ctrl |= m_rs;
        if (m_inverted_backlight_toggle) {
            ctrl |= ((m_backlit) ? 0 : m_backlight);
        } else {
            ctrl |= ((m_backlit) ? m_backlight : 0);
        }

        // send enable (strobe)

        i2c.write(m_en | ctrl);

        // and clear strobe (the display takes the data on the falling edge)

        i2c.write(ctrl);

    }
}